

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

char * archive_entry_copy_fflags_text_len(archive_entry *entry,char *flags,size_t flags_length)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  size_t sVar7;
  unsigned_long *puVar8;
  size_t __n;
  char *__s;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  archive_mstring_copy_mbs_len(&entry->ae_fflags_text,flags,flags_length);
  auVar9 = (undefined1  [16])0x0;
  if (flags_length == 0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    pbVar4 = (byte *)0x0;
    do {
      if ((0x2c < (ulong)(byte)*flags) ||
         ((0x100100000200U >> ((ulong)(byte)*flags & 0x3f) & 1) == 0)) {
        auVar9 = (undefined1  [16])0x0;
        pbVar5 = (byte *)0x0;
        goto LAB_00223940;
      }
      flags = (char *)((byte *)flags + 1);
      flags_length = flags_length - 1;
    } while (flags_length != 0);
  }
  goto LAB_00223a49;
LAB_00223940:
  pbVar4 = (byte *)flags + flags_length;
  pbVar6 = (byte *)flags;
  do {
    if (((ulong)*pbVar6 < 0x2d) && ((0x100100000200U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))
    goto LAB_00223970;
    pbVar6 = pbVar6 + 1;
    flags_length = flags_length - 1;
  } while (flags_length != 0);
  flags_length = 0;
  pbVar6 = pbVar4;
LAB_00223970:
  __n = (long)pbVar6 - (long)flags;
  puVar8 = &fileflags[0].set;
  __s = "nosappnd";
  do {
    sVar7 = strlen(__s);
    if ((__n == sVar7) && (iVar3 = bcmp(flags,__s,__n), iVar3 == 0)) {
      auVar1 = *(undefined1 (*) [16])puVar8;
      auVar10._0_8_ = auVar1._8_8_;
      auVar10._8_4_ = auVar1._0_4_;
      auVar10._12_4_ = auVar1._4_4_;
LAB_002239ec:
      auVar9 = auVar9 | auVar10;
      bVar2 = false;
      goto LAB_002239fb;
    }
    if ((__n == sVar7 - 2) && (iVar3 = bcmp(flags,__s + 2,__n), iVar3 == 0)) {
      auVar10 = *(undefined1 (*) [16])puVar8;
      goto LAB_002239ec;
    }
    __s = *(char **)*(undefined1 (*) [16])(puVar8 + 2);
    puVar8 = puVar8 + 4;
  } while (__s != (char *)0x0);
  bVar2 = true;
LAB_002239fb:
  if (pbVar5 != (byte *)0x0) {
    flags = (char *)pbVar5;
  }
  pbVar4 = (byte *)flags;
  if (!bVar2) {
    pbVar4 = pbVar5;
  }
  if (flags_length != 0) {
    while ((pbVar5 = pbVar4, flags = (char *)pbVar6, (ulong)*pbVar6 < 0x2d &&
           ((0x100100000200U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
      pbVar6 = pbVar6 + 1;
      flags_length = flags_length - 1;
      if (flags_length == 0) goto LAB_00223a49;
    }
    goto LAB_00223940;
  }
LAB_00223a49:
  entry->ae_fflags_set = auVar9._0_8_;
  entry->ae_fflags_clear = auVar9._8_8_;
  return (char *)pbVar4;
}

Assistant:

const char *
archive_entry_copy_fflags_text_len(struct archive_entry *entry,
    const char *flags, size_t flags_length)
{
	archive_mstring_copy_mbs_len(&entry->ae_fflags_text, flags, flags_length);
	return (ae_strtofflags(flags, flags_length,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}